

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::StringOutputStream::Next(StringOutputStream *this,void **data,int *size)

{
  string *psVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  size_t new_size;
  LogMessage *pLVar5;
  int *piVar6;
  char *pcVar7;
  ulong uVar8;
  int local_c4;
  int local_c0;
  LogFinisher local_b9;
  LogMessage local_b8;
  int local_7c;
  LogFinisher local_75;
  int old_size;
  byte local_61;
  LogMessage local_60;
  int *local_28;
  int *size_local;
  void **data_local;
  StringOutputStream *this_local;
  
  local_61 = 0;
  local_28 = size;
  size_local = (int *)data;
  data_local = (void **)this;
  if (this->target_ == (string *)0x0) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0xa0);
    local_61 = 1;
    pLVar5 = internal::LogMessage::operator<<(&local_60,"CHECK failed: target_ != NULL: ");
    internal::LogFinisher::operator=(&local_75,pLVar5);
  }
  if ((local_61 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_60);
  }
  local_7c = std::__cxx11::string::size();
  uVar8 = (ulong)local_7c;
  uVar4 = std::__cxx11::string::capacity();
  iVar3 = local_7c;
  if (uVar8 < uVar4) {
    psVar1 = this->target_;
    new_size = std::__cxx11::string::capacity();
    STLStringResizeUninitialized(psVar1,new_size);
  }
  else {
    iVar2 = std::numeric_limits<int>::max();
    if (iVar2 / 2 < iVar3) {
      internal::LogMessage::LogMessage
                (&local_b8,LOGLEVEL_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                 ,0xad);
      pLVar5 = internal::LogMessage::operator<<
                         (&local_b8,"Cannot allocate buffer larger than kint32max for ");
      pLVar5 = internal::LogMessage::operator<<(pLVar5,"StringOutputStream.");
      internal::LogFinisher::operator=(&local_b9,pLVar5);
      internal::LogMessage::~LogMessage(&local_b8);
      return false;
    }
    psVar1 = this->target_;
    local_c0 = local_7c << 1;
    local_c4 = 0x10;
    piVar6 = std::max<int>(&local_c0,&local_c4);
    STLStringResizeUninitialized(psVar1,(long)*piVar6);
  }
  pcVar7 = mutable_string_data(this->target_);
  *(char **)size_local = pcVar7 + local_7c;
  iVar3 = std::__cxx11::string::size();
  *local_28 = iVar3 - local_7c;
  return true;
}

Assistant:

bool StringOutputStream::Next(void** data, int* size) {
  GOOGLE_CHECK(target_ != NULL);
  int old_size = target_->size();

  // Grow the string.
  if (old_size < target_->capacity()) {
    // Resize the string to match its capacity, since we can get away
    // without a memory allocation this way.
    STLStringResizeUninitialized(target_, target_->capacity());
  } else {
    // Size has reached capacity, try to double the size.
    if (old_size > std::numeric_limits<int>::max() / 2) {
      // Can not double the size otherwise it is going to cause integer
      // overflow in the expression below: old_size * 2 ";
      GOOGLE_LOG(ERROR) << "Cannot allocate buffer larger than kint32max for "
                 << "StringOutputStream.";
      return false;
    }
    // Double the size, also make sure that the new size is at least
    // kMinimumSize.
    STLStringResizeUninitialized(
        target_,
        std::max(old_size * 2,
                 kMinimumSize + 0));  // "+ 0" works around GCC4 weirdness.
  }

  *data = mutable_string_data(target_) + old_size;
  *size = target_->size() - old_size;
  return true;
}